

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

DeferDeserializeFunctionInfo *
Js::DeferDeserializeFunctionInfo::New
          (ScriptContext *scriptContext,int nestedCount,LocalFunctionId functionId,
          ByteCodeCache *byteCodeCache,byte *serializedFunction,Utf8SourceInfo *sourceInfo,
          char16 *displayName,uint displayNameLength,uint displayShortNameOffset,
          NativeModule *nativeModule,Attributes attributes)

{
  Utf8SourceInfo *sourceInfo_00;
  Utf8SourceInfo *serializedFunction_00;
  byte *byteCodeCache_00;
  LocalFunctionId functionId_00;
  int nestedCount_00;
  ScriptContext *scriptContext_00;
  uint functionNumber;
  Recycler *pRVar1;
  DeferDeserializeFunctionInfo *this;
  ThreadContext *this_00;
  TrackAllocData local_78;
  Utf8SourceInfo *local_50;
  Utf8SourceInfo *sourceInfo_local;
  byte *serializedFunction_local;
  ByteCodeCache *byteCodeCache_local;
  LocalFunctionId functionId_local;
  int nestedCount_local;
  ScriptContext *scriptContext_local;
  
  local_50 = sourceInfo;
  sourceInfo_local = (Utf8SourceInfo *)serializedFunction;
  serializedFunction_local = (byte *)byteCodeCache;
  byteCodeCache_local._0_4_ = functionId;
  byteCodeCache_local._4_4_ = nestedCount;
  _functionId_local = scriptContext;
  pRVar1 = ScriptContext::GetRecycler(scriptContext);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_78,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
             ,0x654);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_78);
  this = (DeferDeserializeFunctionInfo *)new<Memory::Recycler>(0x70,pRVar1,0x4642b0);
  scriptContext_00 = _functionId_local;
  nestedCount_00 = byteCodeCache_local._4_4_;
  functionId_00 = (LocalFunctionId)byteCodeCache_local;
  byteCodeCache_00 = serializedFunction_local;
  serializedFunction_00 = sourceInfo_local;
  sourceInfo_00 = local_50;
  this_00 = ScriptContext::GetThreadContext(_functionId_local);
  functionNumber = ThreadContext::NewFunctionNumber(this_00);
  DeferDeserializeFunctionInfo
            (this,nestedCount_00,functionId_00,(ByteCodeCache *)byteCodeCache_00,
             (byte *)serializedFunction_00,sourceInfo_00,scriptContext_00,functionNumber,displayName
             ,displayNameLength,displayShortNameOffset,nativeModule,attributes);
  return this;
}

Assistant:

DeferDeserializeFunctionInfo* DeferDeserializeFunctionInfo::New(ScriptContext* scriptContext, int nestedCount, LocalFunctionId functionId, ByteCodeCache* byteCodeCache, const byte* serializedFunction, Utf8SourceInfo* sourceInfo, const char16* displayName, uint displayNameLength, uint displayShortNameOffset, NativeModule *nativeModule, FunctionInfo::Attributes attributes)
    {
        return RecyclerNewFinalized(scriptContext->GetRecycler(),
            DeferDeserializeFunctionInfo,
            nestedCount,
            functionId,
            byteCodeCache,
            serializedFunction,
            sourceInfo,
            scriptContext,
            scriptContext->GetThreadContext()->NewFunctionNumber(),
            displayName,
            displayNameLength,
            displayShortNameOffset,
            nativeModule,
            attributes);
    }